

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Type> *
wasm::WATParser::tupletype<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Type> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  bool bVar1;
  Type *pTVar2;
  Result<wasm::Type> local_150;
  allocator<char> local_121;
  string local_120;
  Err local_100;
  uintptr_t local_e0;
  uint local_d4;
  Err local_d0;
  Err *local_b0;
  Err *err;
  Result<wasm::Type> _val;
  Result<wasm::Type> elem;
  ulong local_48;
  size_t numElems;
  vector<wasm::Type,_std::allocator<wasm::Type>_> elems;
  ParseModuleTypesCtx *ctx_local;
  
  join_0x00000010_0x00000000_ = sv("tuple",5);
  bVar1 = Lexer::takeSExprStart(&ctx->in,join_0x00000010_0x00000000_);
  if (bVar1) {
    TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeTupleElemList
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&numElems,
               &ctx->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>);
    local_48 = 0;
    do {
      bVar1 = Lexer::takeRParen(&ctx->in);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        if (local_48 < 2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_120,"tuples must have at least two elements",&local_121);
          Lexer::err(&local_100,&ctx->in,&local_120);
          MaybeResult<wasm::Type>::MaybeResult(__return_storage_ptr__,&local_100);
          wasm::Err::~Err(&local_100);
          std::__cxx11::string::~string((string *)&local_120);
          std::allocator<char>::~allocator(&local_121);
          local_d4 = 1;
        }
        else {
          TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeTupleType
                    (&local_150,&ctx->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                     (vector<wasm::Type,_std::allocator<wasm::Type>_> *)&numElems);
          MaybeResult<wasm::Type>::MaybeResult<wasm::Type>(__return_storage_ptr__,&local_150);
          Result<wasm::Type>::~Result(&local_150);
          local_d4 = 1;
        }
        break;
      }
      singlevaltype<wasm::WATParser::ParseModuleTypesCtx>
                ((Result<wasm::Type> *)
                 ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),ctx);
      Result<wasm::Type>::Result
                ((Result<wasm::Type> *)&err,
                 (Result<wasm::Type> *)
                 ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
      local_b0 = Result<wasm::Type>::getErr((Result<wasm::Type> *)&err);
      bVar1 = local_b0 != (Err *)0x0;
      if (bVar1) {
        wasm::Err::Err(&local_d0,local_b0);
        MaybeResult<wasm::Type>::MaybeResult(__return_storage_ptr__,&local_d0);
        wasm::Err::~Err(&local_d0);
      }
      local_d4 = (uint)bVar1;
      Result<wasm::Type>::~Result((Result<wasm::Type> *)&err);
      if (local_d4 == 0) {
        pTVar2 = Result<wasm::Type>::operator*
                           ((Result<wasm::Type> *)
                            ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        local_e0 = pTVar2->id;
        TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::appendTupleElem
                  (&ctx->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                   (vector<wasm::Type,_std::allocator<wasm::Type>_> *)&numElems,(Type)local_e0);
        local_48 = local_48 + 1;
        local_d4 = 0;
      }
      Result<wasm::Type>::~Result
                ((Result<wasm::Type> *)
                 ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
    } while (local_d4 == 0);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&numElems);
  }
  else {
    MaybeResult<wasm::Type>::MaybeResult(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::TypeT> tupletype(Ctx& ctx) {
  if (!ctx.in.takeSExprStart("tuple"sv)) {
    return {};
  }
  auto elems = ctx.makeTupleElemList();
  size_t numElems = 0;
  while (!ctx.in.takeRParen()) {
    auto elem = singlevaltype(ctx);
    CHECK_ERR(elem);
    ctx.appendTupleElem(elems, *elem);
    ++numElems;
  }
  if (numElems < 2) {
    return ctx.in.err("tuples must have at least two elements");
  }
  return ctx.makeTupleType(elems);
}